

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintChar(TidyDocImpl *doc,uint c,uint mode)

{
  int iVar1;
  int iVar2;
  WrapPoint WVar3;
  uint uVar4;
  TidyPrintImpl *pprint_00;
  ctmbstr ptVar5;
  uint vers_1;
  uint vers;
  WrapPoint wp_1;
  WrapPoint wp;
  ctmbstr ent;
  Bool qmark;
  uint outenc;
  TidyPrintImpl *pprint;
  ctmbstr p;
  tmbchar entity [128];
  uint mode_local;
  uint c_local;
  TidyDocImpl *doc_local;
  
  pprint_00 = &doc->pprint;
  iVar1 = (int)(doc->config).value[0x3c].v;
  iVar2 = (int)(doc->config).value[0x46].v;
  entity._120_4_ = mode;
  entity._124_4_ = c;
  if ((c == 0x20) && ((mode & 0x17) == 0)) {
    if ((mode & 8) != 0) {
      _wp_1 = "&nbsp;";
      if (((int)(doc->config).value[0x3a].v != 0) || ((int)(doc->config).value[0x67].v != 0)) {
        _wp_1 = "&#160;";
      }
      AddString(pprint_00,_wp_1);
      return;
    }
    (doc->pprint).wraphere = (doc->pprint).linelen;
  }
  if ((mode & 0x12) != 0) {
    AddChar(pprint_00,c);
    return;
  }
  if ((mode & 0x10) == 0) {
    if (c == 0x3c) {
      AddString(pprint_00,"&lt;");
      return;
    }
    if (c == 0x3e) {
      AddString(pprint_00,"&gt;");
      return;
    }
    if ((((c == 0x26) && ((int)(doc->config).value[0x45].v != 0)) &&
        ((int)(doc->config).value[0x40].v == 0)) && (mode != 4)) {
      AddString(pprint_00,anon_var_dwarf_40466 + 0x2a);
      return;
    }
    if ((c == 0x22) && (iVar2 != 0)) {
      AddString(pprint_00,"&quot;");
      return;
    }
    if ((c == 0x27) && (iVar2 != 0)) {
      AddString(pprint_00,"&#39;");
      return;
    }
    if ((c == 0xa0) && (iVar1 != 0)) {
      if ((int)(doc->config).value[0x47].v == 0) {
        AddChar(pprint_00,0xa0);
        return;
      }
      if (((int)(doc->config).value[0x3a].v == 0) && ((int)(doc->config).value[0x67].v == 0)) {
        AddString(pprint_00,"&nbsp;");
        return;
      }
      AddString(pprint_00,"&#160;");
      return;
    }
  }
  if (iVar1 == 0) {
LAB_0015cc76:
    AddChar(pprint_00,c);
  }
  else {
    if (iVar1 == 4) {
LAB_0015cb89:
      if (((mode & 1) == 0) && ((doc->config).value[0x43].v != 0)) {
        WVar3 = CharacterWrapPoint(c);
        if (WVar3 == WrapBefore) {
          (doc->pprint).wraphere = (doc->pprint).linelen;
        }
        else if (WVar3 == WrapAfter) {
          (doc->pprint).wraphere = (doc->pprint).linelen + 1;
        }
      }
    }
    else {
      if (iVar1 == 5) goto LAB_0015cc76;
      if (iVar1 - 9U < 3) goto LAB_0015cb89;
      if (iVar1 == 0xc) {
        AddChar(pprint_00,c);
        if ((entity._120_4_ & 1) != 0) {
          return;
        }
        if ((doc->config).value[0x43].v == 0) {
          return;
        }
        WVar3 = Big5WrapPoint(entity._124_4_);
        if (WVar3 == WrapBefore) {
          (doc->pprint).wraphere = (doc->pprint).linelen;
          return;
        }
        if (WVar3 != WrapAfter) {
          return;
        }
        (doc->pprint).wraphere = (doc->pprint).linelen + 1;
        return;
      }
      if (iVar1 == 0xd) goto LAB_0015cc76;
    }
    if (iVar1 == 3) {
      if ((uint)entity._124_4_ < 0x100) {
        if (((uint)entity._124_4_ < 0x7f) || (0x9f < (uint)entity._124_4_)) {
          AddChar(pprint_00,entity._124_4_);
        }
        else {
          prvTidytmbsnprintf((tmbstr)&p,0x80,"&#%u;",(ulong)(uint)entity._124_4_);
          AddString(pprint_00,(ctmbstr)&p);
        }
      }
      else {
        uVar4 = prvTidyHTMLVersion(doc);
        if (((int)(doc->config).value[0x3a].v == 0) &&
           (ptVar5 = prvTidyEntityName(entity._124_4_,uVar4), ptVar5 != (ctmbstr)0x0)) {
          prvTidytmbsnprintf((tmbstr)&p,0x80,"&%s;",ptVar5);
        }
        else {
          prvTidytmbsnprintf((tmbstr)&p,0x80,"&#%u;",(ulong)(uint)entity._124_4_);
        }
        AddString(pprint_00,(ctmbstr)&p);
      }
    }
    else if (iVar1 == 4) {
      AddChar(pprint_00,entity._124_4_);
    }
    else if (((iVar1 == 0xb) || (iVar1 == 9)) || (iVar1 == 10)) {
      AddChar(pprint_00,entity._124_4_);
    }
    else if ((int)(doc->config).value[0x67].v == 0) {
      if ((iVar1 == 1) &&
         ((0x7e < (uint)entity._124_4_ || (((uint)entity._124_4_ < 0x20 && (entity._124_4_ != 9)))))
         ) {
        uVar4 = prvTidyHTMLVersion(doc);
        if (((int)(doc->config).value[0x3a].v == 0) &&
           (ptVar5 = prvTidyEntityName(entity._124_4_,uVar4), ptVar5 != (ctmbstr)0x0)) {
          prvTidytmbsnprintf((tmbstr)&p,0x80,"&%s;",ptVar5);
        }
        else {
          prvTidytmbsnprintf((tmbstr)&p,0x80,"&#%u;",(ulong)(uint)entity._124_4_);
        }
        AddString(pprint_00,(ctmbstr)&p);
      }
      else {
        AddChar(pprint_00,entity._124_4_);
      }
    }
    else if (((uint)entity._124_4_ < 0x80) || (iVar1 != 1)) {
      AddChar(pprint_00,entity._124_4_);
    }
    else {
      prvTidytmbsnprintf((tmbstr)&p,0x80,"&#%u;",(ulong)(uint)entity._124_4_);
      AddString(pprint_00,(ctmbstr)&p);
    }
  }
  return;
}

Assistant:

static void PPrintChar( TidyDocImpl* doc, uint c, uint mode )
{
    tmbchar entity[128];
    ctmbstr p;
    TidyPrintImpl* pprint  = &doc->pprint;
    uint outenc = cfg( doc, TidyOutCharEncoding );
    Bool qmark = cfgBool( doc, TidyQuoteMarks );

    if ( c == ' ' && !(mode & (PREFORMATTED | COMMENT | ATTRIBVALUE | CDATA)))
    {
        /* coerce a space character to a non-breaking space */
        if (mode & NOWRAP)
        {
            ctmbstr ent = "&nbsp;";
            /* by default XML doesn't define &nbsp; */
            if ( cfgBool(doc, TidyNumEntities) || cfgBool(doc, TidyXmlTags) )
                ent = "&#160;";
            AddString( pprint, ent );
            return;
        }
        else
            pprint->wraphere = pprint->linelen;
    }

    /* comment characters are passed raw */
    if ( mode & (COMMENT | CDATA) )
    {
        AddChar( pprint, c );
        return;
    }

    /* except in CDATA map < to &lt; etc. */
    if ( !(mode & CDATA) )
    {
        if ( c == '<')
        {
            AddString( pprint, "&lt;" );
            return;
        }
            
        if ( c == '>')
        {
            AddString( pprint, "&gt;" );
            return;
        }

        /*
          naked '&' chars can be left alone or
          quoted as &amp; The latter is required
          for XML where naked '&' are illegal.
        */
        if ( c == '&' && cfgBool(doc, TidyQuoteAmpersand)
             && !cfgBool(doc, TidyPreserveEntities)
             && ( mode != OtherNamespace) ) /* #130 MathML attr and entity fix! */
        {
            AddString( pprint, "&amp;" );
            return;
        }

        if ( c == '"' && qmark )
        {
            AddString( pprint, "&quot;" );
            return;
        }

        if ( c == '\'' && qmark )
        {
            AddString( pprint, "&#39;" );
            return;
        }

        if ( c == 160 && outenc != RAW )
        {
            if ( cfgBool(doc, TidyQuoteNbsp) )
            {
                if ( cfgBool(doc, TidyNumEntities) ||
                     cfgBool(doc, TidyXmlTags) )
                    AddString( pprint, "&#160;" );
                else
                    AddString( pprint, "&nbsp;" );
            }
            else
                AddChar( pprint, c );
            return;
        }
    }

    /* #431953 - start RJ */
    /* Handle encoding-specific issues */
    switch ( outenc )
    {
    case UTF8:
    case UTF16:
    case UTF16LE:
    case UTF16BE:
        if (!(mode & PREFORMATTED) && cfg(doc, TidyPunctWrap))
        {
            WrapPoint wp = CharacterWrapPoint(c);
            if (wp == WrapBefore)
                pprint->wraphere = pprint->linelen;
            else if (wp == WrapAfter)
                pprint->wraphere = pprint->linelen + 1;
        }
        break;

    case BIG5:
        /* Allow linebreak at Chinese punctuation characters */
        /* There are not many spaces in Chinese */
        AddChar( pprint, c );
        if (!(mode & PREFORMATTED)  && cfg(doc, TidyPunctWrap))
        {
            WrapPoint wp = Big5WrapPoint(c);
            if (wp == WrapBefore)
                pprint->wraphere = pprint->linelen;
            else if (wp == WrapAfter)
                pprint->wraphere = pprint->linelen + 1;
        }
        return;

    case SHIFTJIS:
#ifndef NO_NATIVE_ISO2022_SUPPORT
    case ISO2022: /* ISO 2022 characters are passed raw */
#endif
    case RAW:
        AddChar( pprint, c );
        return;
    }

    /* don't map latin-1 chars to entities */
    if ( outenc == LATIN1 )
    {
        if (c > 255)  /* multi byte chars */
        {
            uint vers = TY_(HTMLVersion)( doc );
            if ( !cfgBool(doc, TidyNumEntities) && (p = TY_(EntityName)(c, vers)) )
                TY_(tmbsnprintf)(entity, sizeof(entity), "&%s;", p);
            else
                TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);

            AddString( pprint, entity );
            return;
        }

        if (c > 126 && c < 160)
        {
            TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);
            AddString( pprint, entity );
            return;
        }

        AddChar( pprint, c );
        return;
    }

    /* don't map UTF-8 chars to entities */
    if ( outenc == UTF8 )
    {
        AddChar( pprint, c );
        return;
    }

    /* don't map UTF-16 chars to entities */
    if ( outenc == UTF16 || outenc == UTF16LE || outenc == UTF16BE )
    {
        AddChar( pprint, c );
        return;
    }

    /* use numeric entities only  for XML */
    if ( cfgBool(doc, TidyXmlTags) )
    {
        /* if ASCII use numeric entities for chars > 127 */
        if ( c > 127 && outenc == ASCII )
        {
            TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);
            AddString( pprint, entity );
            return;
        }

        /* otherwise output char raw */
        AddChar( pprint, c );
        return;
    }

    /* default treatment for ASCII */
    if ( outenc == ASCII && (c > 126 || (c < ' ' && c != '\t')) )
    {
        uint vers = TY_(HTMLVersion)( doc );
        if (!cfgBool(doc, TidyNumEntities) && (p = TY_(EntityName)(c, vers)) )
            TY_(tmbsnprintf)(entity, sizeof(entity), "&%s;", p);
        else
            TY_(tmbsnprintf)(entity, sizeof(entity), "&#%u;", c);

        AddString( pprint, entity );
        return;
    }

    AddChar( pprint, c );
}